

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.h
# Opt level: O3

void __thiscall XPMP2::FmodError::LogErr(FmodError *this)

{
  int ln;
  FMOD_RESULT FVar1;
  char *szPath;
  char *szFunc;
  undefined8 uVar2;
  char *pcVar3;
  
  szPath = (this->sFile)._M_dataplus._M_p;
  ln = this->ln;
  szFunc = (this->sFunc)._M_dataplus._M_p;
  FVar1 = this->fmodRes;
  if ((ulong)FVar1 < 0x52) {
    pcVar3 = &DAT_0028f58c + *(int *)(&DAT_0028f58c + (ulong)FVar1 * 4);
  }
  else {
    pcVar3 = "Unknown error.";
  }
  uVar2 = (**(code **)(*(long *)this + 0x10))();
  LogMsg(szPath,ln,szFunc,logERR,"FMOD Error %d - \'%s\' in %s",(ulong)FVar1,pcVar3,uVar2);
  return;
}

Assistant:

bool ShallUnpause () { return nPauseCountdown > 0 ? (--nPauseCountdown == 0) : false;  }